

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

void EthBasePort::PrintEthernetPacket(ostream *out,quadlet_t *packet,uint max_quads)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  char *pcVar5;
  
  poVar3 = std::operator<<(out,"Ethernet Frame:");
  std::endl<char,std::char_traits<char>>(poVar3);
  PrintMAC(out,"  Dest MAC",(uint8_t *)packet,true);
  PrintMAC(out,"  Src MAC",(uint8_t *)((long)packet + 6),true);
  poVar3 = std::operator<<(out,"  Ethertype/Length: ");
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
  poVar3 = std::operator<<(poVar3,0x30);
  plVar4 = (long *)std::ostream::operator<<(poVar3,(ushort)packet[3]);
  *(uint *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x18) =
       *(uint *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
  if ((short)packet[3] == 0x800) {
    pcVar5 = " (IPv4)";
LAB_0011483f:
    std::operator<<(out,pcVar5);
  }
  else if ((short)packet[3] == 0x806) {
    pcVar5 = " (ARP)";
    goto LAB_0011483f;
  }
  std::endl<char,std::char_traits<char>>(out);
  if ((short)packet[3] == 0x806) {
    poVar3 = std::operator<<(out,"  ARP:");
    std::endl<char,std::char_traits<char>>(poVar3);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::operator<<(out,"    htype:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)packet + 0x22));
    poVar3 = std::operator<<(poVar3,", ptype:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)packet[9]);
    poVar3 = std::operator<<(poVar3,", hlen:");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", plen: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", oper:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)packet[10]);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar3);
    PrintMAC(out,"    Src MAC",(uint8_t *)((long)packet + 0x2a),true);
    PrintIP(out,"    Src IP",(uint8_t *)(packet + 0xc),true);
    PrintIP(out,"    Dest IP",(uint8_t *)((long)packet + 0x3a),true);
    return;
  }
  if ((short)packet[3] != 0x800) {
    poVar3 = std::operator<<(out,"  Raw frame (len = ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)packet[3]);
    out = std::operator<<(poVar3,")");
    goto LAB_00114c84;
  }
  poVar3 = std::operator<<(out,"  IPv4:");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(out,"    Version: ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,(uint)(*(ushort *)((long)packet + 0xe) >> 0xc));
  poVar3 = std::operator<<(poVar3,", IHL: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(byte *)((long)packet + 0xf) & 0xf);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(out,"    Length: ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)packet[4]);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(out,"    Flags: ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(out,", TTL: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(out,"    Protocol: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  if (*(char *)((long)packet + 0x16) == '\x01') {
    pcVar5 = " (ICMP)";
LAB_00114b05:
    std::operator<<(out,pcVar5);
  }
  else if (*(char *)((long)packet + 0x16) == '\x11') {
    pcVar5 = " (UDP)";
    goto LAB_00114b05;
  }
  std::endl<char,std::char_traits<char>>(out);
  PrintIP(out,"    Host IP",(uint8_t *)((long)packet + 0x1a),true);
  PrintIP(out,"    Dest IP",(uint8_t *)((long)packet + 0x1e),true);
  if (*(char *)((long)packet + 0x16) == '\x11') {
    poVar3 = std::operator<<(out,"    UDP:");
    std::endl<char,std::char_traits<char>>(poVar3);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = std::operator<<(out,"      Host Port: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)packet + 0x22));
    std::endl<char,std::char_traits<char>>(poVar3);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = std::operator<<(out,"      Dest Port: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)packet[9]);
    std::endl<char,std::char_traits<char>>(poVar3);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = std::operator<<(out,"      Length: ");
    out = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)packet + 0x26));
  }
  else {
    if (*(char *)((long)packet + 0x16) != '\x01') {
      return;
    }
    poVar3 = std::operator<<(out,"    ICMP:");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(out,"      Type: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Code: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    if ((*(char *)((long)packet + 0x23) == '\b') && (*(char *)((long)packet + 0x22) == '\0')) {
      std::operator<<(out," (Echo Request)");
    }
  }
LAB_00114c84:
  std::endl<char,std::char_traits<char>>(out);
  return;
}

Assistant:

void EthBasePort::PrintEthernetPacket(std::ostream &out, const quadlet_t *packet, unsigned int max_quads)
{
    struct FrameHeader {
        uint8_t  destMac[6];
        uint8_t  srcMac[6];
        uint16_t etherType;
    };
    struct IPv4Header {
        uint16_t word0;
        uint16_t length;
        uint16_t ident;
        uint16_t flags;
        uint8_t  protocol;
        uint8_t  ttl;
        uint16_t checksum;
        uint8_t  hostIP[4];
        uint8_t  destIP[4];
    };
    struct UDPHeader {
        uint16_t hostPort;
        uint16_t destPort;
        uint16_t length;
        uint16_t checksum;
    };
    struct ARPHeader {
        uint16_t htype;
        uint16_t ptype;
        uint8_t  plen;
        uint8_t  hlen;
        uint16_t oper;
        uint8_t  srcMac[6];
        uint8_t  srcIP[4];
        uint8_t  destMac[6];  // ignored
        uint8_t  destIP[4];
    };
    // Easier to work with 16-bit data, since that is how it is stored on FPGA.
    const uint16_t *packetw = reinterpret_cast<const uint16_t *>(packet);

    const FrameHeader *frame = reinterpret_cast<const FrameHeader *>(packetw);
    out << "Ethernet Frame:" << std::endl;
    EthBasePort::PrintMAC(out, "  Dest MAC", frame->destMac, true);
    EthBasePort::PrintMAC(out, "  Src MAC", frame->srcMac, true);
    out << "  Ethertype/Length: " << std::hex << std::setw(4) << std::setfill('0') << frame->etherType << std::dec;
    if (frame->etherType == 0x0800) out << " (IPv4)";
    else if (frame->etherType == 0x0806) out << " (ARP)";
    out << std::endl;
    if (frame->etherType == 0x0800) {
        const IPv4Header *ipv4 = reinterpret_cast<const IPv4Header *>(packetw+7);
        out << "  IPv4:" << std::endl;
        out << "    Version: " << std::dec << ((ipv4->word0&0xf000)>>12) << ", IHL: " << ((ipv4->word0&0x0f00)>>8) << std::endl;
        out << "    Length: " << std::dec << ipv4->length << std::endl;
        unsigned int flags = (ipv4->flags&0xc0)>>13;
        out << "    Flags: " << std::dec << flags;
        if (flags == 2) out << " (DF)";
        out << ", TTL: " << static_cast<unsigned int>(ipv4->ttl) << std::endl;
        out << "    Protocol: " << static_cast<unsigned int>(ipv4->protocol);
        if (ipv4->protocol == 1) out << " (ICMP)";
        else if (ipv4->protocol == 17) out << " (UDP)";
        out << std::endl;
        EthBasePort::PrintIP(out, "    Host IP", ipv4->hostIP, true);
        EthBasePort::PrintIP(out, "    Dest IP", ipv4->destIP, true);
        if (ipv4->protocol == 1) {
            const uint8_t *icmp = reinterpret_cast<const uint8_t *>(packetw+17);
            out << "    ICMP:" << std::endl;
            out << "      Type: " << static_cast<unsigned int>(icmp[1])
                << ", Code: " << static_cast<unsigned int>(icmp[0]);
            if ((icmp[1] == 8) && (icmp[0] == 0)) out << " (Echo Request)";
            out << std::endl;
        }
        else if (ipv4->protocol == 17) {
            const UDPHeader *udp = reinterpret_cast<const UDPHeader *>(packetw+17);
            out << "    UDP:" << std::endl;
            out << std::dec << "      Host Port: " << udp->hostPort << std::endl;
            out << std::dec << "      Dest Port: " << udp->destPort << std::endl;
            out << std::dec << "      Length: " << udp->length << std::endl;
        }
    }
    else if (frame->etherType == 0x0806) {
        const ARPHeader *arp = reinterpret_cast<const ARPHeader *>(packetw+17);
        out << "  ARP:" << std::endl;
        out << std::hex << "    htype:" << arp->htype << ", ptype:" << arp->ptype
            << ", hlen:" << static_cast<unsigned int>(arp->hlen)
            << ", plen: " << static_cast<unsigned int>(arp->plen)
            << ", oper:" << arp->oper << std::dec << std::endl;
        EthBasePort::PrintMAC(out, "    Src MAC", arp->srcMac, true);
        EthBasePort::PrintIP(out, "    Src IP", arp->srcIP, true);
        EthBasePort::PrintIP(out, "    Dest IP", arp->destIP, true);
    }
    else {
        out << "  Raw frame (len = " << std::dec << frame->etherType << ")" << std::endl;
    }
}